

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O2

void __thiscall chrono::ChParticleCloud::VariablesQbSetSpeed(ChParticleCloud *this,double step)

{
  double dVar1;
  pointer ppCVar2;
  ChAparticle *pCVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  uint uVar6;
  ulong uVar7;
  double dVar8;
  double oos;
  ChVectorRef local_c0;
  ChVector<double> v;
  ChVector<double> local_48;
  
  uVar6 = 0;
  dVar8 = 1.0 / step;
  while( true ) {
    ppCVar2 = (this->particles).
              super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar7 = (ulong)uVar6;
    if ((ulong)((long)(this->particles).
                      super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 >> 3) <= uVar7)
    break;
    pCVar3 = ppCVar2[uVar7];
    auVar4 = *(undefined1 (*) [16])
              (pCVar3->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.pos.m_data;
    dVar1 = *(double *)
             ((long)&(pCVar3->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt + 0x10);
    auVar5 = *(undefined1 (*) [32])
              ((ChQuaternion<double> *)
              ((long)&(pCVar3->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt + 0x18))->
              m_data;
    ChVariables::Get_qb(&local_c0,(ChVariables *)&pCVar3->variables);
    Eigen::
    VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
    VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
                 *)&v,&local_c0,0,3);
    ChVector<double>::
    ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
              (&local_48,
               (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                *)&v,(type *)0x0);
    (**(code **)(*(long *)&(pCVar3->super_ChParticleBase).super_ChFrameMoving<double>.
                           super_ChFrame<double> + 0x38))(pCVar3,&local_48);
    pCVar3 = (this->particles).
             super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar7];
    ChVariables::Get_qb(&local_c0,(ChVariables *)&pCVar3->variables);
    Eigen::
    VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
    VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
                 *)&v,&local_c0,3,3);
    ChVector<double>::
    ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
              (&local_48,
               (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                *)&v,(type *)0x0);
    (**(code **)(*(long *)&(pCVar3->super_ChParticleBase).super_ChFrameMoving<double>.
                           super_ChFrame<double> + 0x48))(pCVar3,&local_48);
    if ((step != 0.0) || (NAN(step))) {
      pCVar3 = (this->particles).
               super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar7];
      auVar4 = vsubpd_avx(*(undefined1 (*) [16])
                           (pCVar3->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.pos.
                           m_data,auVar4);
      v.m_data[0] = auVar4._0_8_ * dVar8;
      v.m_data[1] = auVar4._8_8_ * dVar8;
      v.m_data[2] = (*(double *)
                      ((long)&(pCVar3->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt +
                      0x10) - dVar1) * dVar8;
      (**(code **)(*(long *)&(pCVar3->super_ChParticleBase).super_ChFrameMoving<double>.
                             super_ChFrame<double> + 0x60))
                (pCVar3,(MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                         *)&v);
      pCVar3 = (this->particles).
               super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar7];
      auVar5 = vsubpd_avx(*(undefined1 (*) [32])
                           ((ChQuaternion<double> *)
                           ((long)&(pCVar3->super_ChParticleBase).super_ChFrameMoving<double>.
                                   coord_dt + 0x18))->m_data,auVar5);
      v.m_data[0] = auVar5._0_8_ * dVar8;
      v.m_data[1] = auVar5._8_8_ * dVar8;
      v.m_data[2] = auVar5._16_8_ * dVar8;
      (**(code **)(*(long *)&(pCVar3->super_ChParticleBase).super_ChFrameMoving<double>.
                             super_ChFrame<double> + 0x68))
                (pCVar3,(MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                         *)&v);
    }
    uVar6 = uVar6 + 1;
  }
  return;
}

Assistant:

void ChParticleCloud::VariablesQbSetSpeed(double step) {
    for (unsigned int j = 0; j < particles.size(); j++) {
        ChCoordsys<> old_coord_dt = particles[j]->GetCoord_dt();

        // from 'qb' vector, sets body speed, and updates auxiliary data
        particles[j]->SetPos_dt(particles[j]->variables.Get_qb().segment(0, 3));
        particles[j]->SetWvel_loc(particles[j]->variables.Get_qb().segment(3, 3));

        // apply limits (if in speed clamping mode) to speeds.
        // ClampSpeed(); NO - do only per-particle, here.. (but.. really needed here?)

        // Compute accel. by BDF (approximate by differentiation);
        if (step) {
            particles[j]->SetPos_dtdt((particles[j]->GetCoord_dt().pos - old_coord_dt.pos) / step);
            particles[j]->SetRot_dtdt((particles[j]->GetCoord_dt().rot - old_coord_dt.rot) / step);
        }
    }
}